

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<unsigned_long> __thiscall
capnp::compiler::Compiler::lookup(Compiler *this,uint64_t parent,StringPtr childName)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar1;
  
  kj::_::Mutex::lock((Mutex *)(parent + 8),0);
  Impl::lookup((Impl *)this,*(uint64_t *)(parent + 0x28),childName);
  kj::_::Mutex::unlock((Mutex *)(parent + 8),EXCLUSIVE,(Waiter *)0x0);
  MVar1.ptr.field_1.value = extraout_RDX.value;
  MVar1.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar1.ptr;
}

Assistant:

kj::Maybe<uint64_t> Compiler::lookup(uint64_t parent, kj::StringPtr childName) const {
  return impl.lockExclusive()->get()->lookup(parent, childName);
}